

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

bool __thiscall ON_Quaternion::Unitize(ON_Quaternion *this)

{
  bool bVar1;
  double dVar2;
  ON_Quaternion q;
  ON_Quaternion local_30;
  
  dVar2 = Length(this);
  if (dVar2 <= 2.2250738585072014e-308) {
    if (0.0 < dVar2) {
      dVar2 = this->c * 1e+300;
      ON_Quaternion(&local_30,this->a * 1e+300,this->b * 1e+300,dVar2,dVar2);
      bVar1 = Unitize(&local_30);
      if (bVar1) {
        this->a = local_30.a;
        this->b = local_30.b;
        this->c = local_30.c;
        this->d = local_30.d;
        goto LAB_005a0221;
      }
    }
    bVar1 = false;
  }
  else {
    dVar2 = 1.0 / dVar2;
    this->a = this->a * dVar2;
    this->b = this->b * dVar2;
    this->c = this->c * dVar2;
    this->d = dVar2 * this->d;
LAB_005a0221:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ON_Quaternion::Unitize()
{
  double x = Length();

  if (x > ON_DBL_MIN)
  {
    x = 1.0/x;
    a *= x; b *= x; c *= x; d *= x;
  }
  else if ( x > 0.0 )
  {
    ON_Quaternion q(a*1.0e300,b*1.0e300,c*1.0e300,c*1.0e300);
    if ( !q.Unitize() )
      return false;
    a = q.a; 
    b = q.b;
    c = q.c;
    d = q.d;
  }
  else
  {
    return false;
  }

  return true;
}